

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

OneWayPipe *
kj::newOneWayPipe(OneWayPipe *__return_storage_ptr__,Maybe<unsigned_long> *expectedLength)

{
  RefOrVoid<kj::(anonymous_namespace)::AsyncPipe> object;
  Own<kj::AsyncInputStream> *pOVar1;
  Own<kj::(anonymous_namespace)::AsyncPipe> *params;
  Own<kj::AsyncOutputStream> *other;
  Own<kj::(anonymous_namespace)::PipeWriteEnd> local_b0;
  undefined1 local_a0 [8];
  Own<kj::AsyncOutputStream> writeEnd;
  Own<kj::AsyncInputStream> local_80;
  unsigned_long *local_70;
  unsigned_long *l;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_58;
  Own<kj::(anonymous_namespace)::PipeReadEnd> local_48;
  undefined1 local_38 [8];
  Own<kj::AsyncInputStream> readEnd;
  Own<kj::(anonymous_namespace)::AsyncPipe> impl;
  Maybe<unsigned_long> *expectedLength_local;
  
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  object = Own<kj::(anonymous_namespace)::AsyncPipe>::operator*
                     ((Own<kj::(anonymous_namespace)::AsyncPipe> *)&readEnd.ptr);
  addRef<kj::(anonymous_namespace)::AsyncPipe>((kj *)&local_58,object);
  heap<kj::(anonymous_namespace)::PipeReadEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
            ((kj *)&local_48,&local_58);
  Own<kj::AsyncInputStream>::Own<kj::(anonymous_namespace)::PipeReadEnd,void>
            ((Own<kj::AsyncInputStream> *)local_38,&local_48);
  Own<kj::(anonymous_namespace)::PipeReadEnd>::~Own(&local_48);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_58);
  local_70 = _::readMaybe<unsigned_long>(expectedLength);
  if (local_70 != (unsigned_long *)0x0) {
    pOVar1 = mv<kj::Own<kj::AsyncInputStream>>((Own<kj::AsyncInputStream> *)local_38);
    heap<kj::(anonymous_namespace)::LimitedInputStream,kj::Own<kj::AsyncInputStream>,unsigned_long&>
              ((kj *)&writeEnd.ptr,pOVar1,local_70);
    Own<kj::AsyncInputStream>::Own<kj::(anonymous_namespace)::LimitedInputStream,void>
              (&local_80,(Own<kj::(anonymous_namespace)::LimitedInputStream> *)&writeEnd.ptr);
    Own<kj::AsyncInputStream>::operator=((Own<kj::AsyncInputStream> *)local_38,&local_80);
    Own<kj::AsyncInputStream>::~Own(&local_80);
    Own<kj::(anonymous_namespace)::LimitedInputStream>::~Own
              ((Own<kj::(anonymous_namespace)::LimitedInputStream> *)&writeEnd.ptr);
  }
  params = mv<kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
                     ((Own<kj::(anonymous_namespace)::AsyncPipe> *)&readEnd.ptr);
  heap<kj::(anonymous_namespace)::PipeWriteEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
            ((kj *)&local_b0,params);
  Own<kj::AsyncOutputStream>::Own<kj::(anonymous_namespace)::PipeWriteEnd,void>
            ((Own<kj::AsyncOutputStream> *)local_a0,&local_b0);
  Own<kj::(anonymous_namespace)::PipeWriteEnd>::~Own(&local_b0);
  pOVar1 = mv<kj::Own<kj::AsyncInputStream>>((Own<kj::AsyncInputStream> *)local_38);
  Own<kj::AsyncInputStream>::Own(&__return_storage_ptr__->in,pOVar1);
  other = mv<kj::Own<kj::AsyncOutputStream>>((Own<kj::AsyncOutputStream> *)local_a0);
  Own<kj::AsyncOutputStream>::Own(&__return_storage_ptr__->out,other);
  Own<kj::AsyncOutputStream>::~Own((Own<kj::AsyncOutputStream> *)local_a0);
  Own<kj::AsyncInputStream>::~Own((Own<kj::AsyncInputStream> *)local_38);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe> *)&readEnd.ptr);
  return __return_storage_ptr__;
}

Assistant:

OneWayPipe newOneWayPipe(kj::Maybe<uint64_t> expectedLength) {
  auto impl = kj::refcounted<AsyncPipe>();
  Own<AsyncInputStream> readEnd = kj::heap<PipeReadEnd>(kj::addRef(*impl));
  KJ_IF_MAYBE(l, expectedLength) {
    readEnd = kj::heap<LimitedInputStream>(kj::mv(readEnd), *l);
  }
  Own<AsyncOutputStream> writeEnd = kj::heap<PipeWriteEnd>(kj::mv(impl));
  return { kj::mv(readEnd), kj::mv(writeEnd) };
}